

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aatree.c
# Opt level: O3

Aatree * dodelete(DelInfo *info,Aatree *T,void **ret_value)

{
  int iVar1;
  Aatree *pAVar2;
  void *pvVar3;
  int iVar4;
  Aatree *pAVar5;
  Aatree **ppAVar6;
  Aatree *L;
  Aatree *pAVar7;
  Aatree *pAVar8;
  Aatree *R;
  long lVar9;
  
  if (T == &nil) {
    return &nil;
  }
  info->last = T;
  iVar4 = (*info->compare)(info->key,T->key);
  if (iVar4 < 0) {
    lVar9 = 8;
  }
  else {
    info->deleted = T;
    lVar9 = 0x10;
  }
  pAVar5 = dodelete(info,*(Aatree **)((long)&T->level + lVar9),ret_value);
  *(Aatree **)((long)&T->level + lVar9) = pAVar5;
  if (((info->last == T) && (info->deleted != &nil)) &&
     (iVar4 = (*info->compare)(info->key,info->deleted->key), iVar4 == 0)) {
    pAVar5 = T->right;
    *ret_value = info->deleted->value;
    pAVar8 = info->deleted;
    pvVar3 = T->value;
    pAVar8->key = T->key;
    pAVar8->value = pvVar3;
    info->deleted = &nil;
    al_free_with_context
              (T,0x8b,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/misc/aatree.c"
               ,"dodelete");
    return pAVar5;
  }
  pAVar5 = T->left;
  iVar1 = T->level;
  iVar4 = iVar1 + -1;
  pAVar8 = T->right;
  if ((iVar4 <= pAVar5->level) && (iVar4 <= pAVar8->level)) {
    return T;
  }
  T->level = iVar4;
  if (iVar1 <= pAVar8->level) {
    pAVar8->level = iVar4;
    iVar4 = T->level;
  }
  if (pAVar5->level == iVar4) {
    ppAVar6 = &pAVar5->right;
    T->left = pAVar5->right;
    pAVar5->right = T;
    pAVar8 = T;
  }
  else {
    ppAVar6 = &T->right;
    pAVar5 = T;
    pAVar7 = &nil;
    if (pAVar8 == &nil) goto LAB_00182117;
  }
  pAVar2 = pAVar8->left;
  pAVar7 = pAVar8;
  if (pAVar2->level == pAVar8->level) {
    pAVar8->left = pAVar2->right;
    pAVar2->right = pAVar8;
    pAVar7 = pAVar2;
  }
LAB_00182117:
  pAVar5->right = pAVar7;
  pAVar8 = pAVar7->right;
  if (pAVar8 == &nil) {
    pAVar8 = &nil;
  }
  else {
    pAVar2 = pAVar8->left;
    if (pAVar2->level == pAVar8->level) {
      pAVar8->left = pAVar2->right;
      pAVar2->right = pAVar8;
      pAVar7 = *ppAVar6;
      pAVar8 = pAVar2;
    }
  }
  pAVar7->right = pAVar8;
  pAVar8 = &nil;
  if ((pAVar5 != &nil) &&
     (pAVar7 = *ppAVar6, pAVar8 = pAVar5, pAVar5->level == pAVar7->right->level)) {
    *ppAVar6 = pAVar7->left;
    pAVar7->left = pAVar5;
    pAVar7->level = pAVar7->level + 1;
    pAVar8 = pAVar7;
  }
  pAVar5 = pAVar8->right;
  pAVar7 = &nil;
  if ((pAVar5 != &nil) &&
     (pAVar2 = pAVar5->right, pAVar7 = pAVar5, pAVar5->level == pAVar2->right->level)) {
    pAVar5->right = pAVar2->left;
    pAVar2->left = pAVar5;
    pAVar2->level = pAVar2->level + 1;
    pAVar7 = pAVar2;
  }
  pAVar8->right = pAVar7;
  return pAVar8;
}

Assistant:

static Aatree *dodelete(struct DelInfo *info, Aatree *T, void **ret_value)
{
   if (T == &nil)
      return T;

   /* Search down the tree and set pointers last and deleted. */
   info->last = T;
   if (info->compare(info->key, T->key) < 0) {
      T->left = dodelete(info, T->left, ret_value);
   }
   else {
      info->deleted = T;
      T->right = dodelete(info, T->right, ret_value);
   }

   /* At the bottom of the tree we remove the element if it is present. */
   if (T == info->last &&
      info->deleted != &nil &&
      info->compare(info->key, info->deleted->key) == 0)
   {
      Aatree *right = T->right;
      *ret_value = info->deleted->value;
      info->deleted->key = T->key;
      info->deleted->value = T->value;
      info->deleted = &nil;
      al_free(T);
      return right;
   }

   /* On the way back, we rebalance. */
   if (T->left->level < T->level - 1
      || T->right->level < T->level - 1)
   {
      T->level--;
      if (T->right->level > T->level) {
         T->right->level = T->level;
      }
      T = skew(T);
      T->right = skew(T->right);
      T->right->right = skew(T->right->right);
      T = split(T);
      T->right = split(T->right);
   }
   return T;
}